

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brdf_plot.cpp
# Opt level: O0

void __thiscall brdf_plot::setup_camera(brdf_plot *this)

{
  mat<4,_4,_float,_(glm::precision)0> *m;
  vec<3,_float,_(glm::precision)0> *in_R8;
  vec<3,_float,_(glm::precision)0> vVar1;
  mat<4,_4,_float,_(glm::precision)0> local_100;
  undefined1 local_c0 [8];
  mat4 view_matrix;
  vec3 up_vector;
  float local_6c;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  vec<3,_float,_(glm::precision)0> local_44;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_38;
  undefined8 local_28;
  float local_20;
  undefined8 local_1c;
  float local_14;
  brdf_plot *local_10;
  brdf_plot *this_local;
  
  local_10 = this;
  glm::vec<3,float,(glm::precision)0>::vec<double,float,float>
            ((vec<3,float,(glm::precision)0> *)&local_1c,0.0,0.0,0.0);
  (this->_sphere_origin).field_0.field_0.z = local_14;
  *(undefined8 *)&(this->_sphere_origin).field_0 = local_1c;
  this->_sphere_radius = 1.0;
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_44,-1.0,1.0,1.0);
  vVar1 = glm::normalize<3,float,(glm::precision)0,glm::vec>(&local_44);
  local_50 = vVar1.field_0._8_4_;
  local_38.field_0.z = local_50;
  local_58 = vVar1.field_0._0_8_;
  local_38._0_8_ = local_58;
  vVar1 = glm::operator*(1.2,(vec<3,_float,_(glm::precision)0> *)&local_38.field_0);
  local_68 = vVar1.field_0._0_8_;
  local_28 = local_68;
  local_60 = vVar1.field_0._8_4_;
  local_20 = local_60;
  *(undefined8 *)&(this->_eye_position).field_0 = local_68;
  (this->_eye_position).field_0.field_0.z = local_60;
  glm::vec<3,_float,_(glm::precision)0>::vec
            ((vec<3,_float,_(glm::precision)0> *)((long)&up_vector.field_0 + 4),0.0,0.0,0.0);
  *(undefined8 *)&(this->_eye_target).field_0 = up_vector.field_0._4_8_;
  (this->_eye_target).field_0.field_0.z = local_6c;
  glm::vec<3,_float,_(glm::precision)0>::vec
            ((vec<3,_float,_(glm::precision)0> *)((long)&view_matrix.value[3].field_0 + 8),0.0,0.0,
             1.0);
  glm::lookAt<float,(glm::precision)0>
            ((mat<4,_4,_float,_(glm::precision)0> *)local_c0,(glm *)&this->_eye_position,
             &this->_sphere_origin,
             (vec<3,_float,_(glm::precision)0> *)((long)&view_matrix.value[3].field_0 + 8),in_R8);
  glm::inverse<4,4,float,(glm::precision)0,glm::mat>(&local_100,(glm *)local_c0,m);
  memcpy(&this->_view_matrix_inv,&local_100,0x40);
  return;
}

Assistant:

void brdf_plot::setup_camera()
{
  _sphere_origin = {0.0, 0.0f, 0.0f};
  _sphere_radius = 1.0f;

  _eye_position = 1.2f * glm::normalize(glm::vec3{-1.0f, 1.0f, 1.0f});
  _eye_target = {0.0f, 0.0f, 0.0f};

  glm::vec3 up_vector{0.0f, 0.0f, 1.0f};
  glm::mat4 view_matrix = glm::lookAt(_eye_position, _sphere_origin, up_vector);

  _view_matrix_inv = glm::inverse(view_matrix);
}